

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

void __thiscall cimg_library::CImgDisplay::_init_fullscreen(CImgDisplay *this)

{
  Display *pDVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  int iVar5;
  Window WVar6;
  timespec local_1f0;
  XWindowAttributes attr;
  XEvent event;
  XSetWindowAttributes attr_set;
  
  if ((this->_is_fullscreen == true) && (this->_is_closed == false)) {
    if (cimg::X11_attr()::val == '\0') {
      iVar5 = __cxa_guard_acquire(&cimg::X11_attr()::val);
      if (iVar5 != 0) {
        cimg::X11_static::X11_static(&cimg::X11_attr::val);
        __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
        __cxa_guard_release(&cimg::X11_attr()::val);
      }
    }
    pDVar1 = cimg::X11_attr::val.display;
    this->_background_window = 0;
    uVar2 = screen_width();
    uVar3 = screen_height();
    if ((uVar2 != this->_width) || (uVar3 != this->_height)) {
      uVar4 = XDefaultScreen(pDVar1);
      attr_set.background_pixel = XBlackPixel(pDVar1,uVar4);
      attr_set.override_redirect = 1;
      WVar6 = XCreateWindow(pDVar1,*(undefined8 *)
                                    (*(long *)(pDVar1 + 0xe8) + 0x10 +
                                    (long)*(int *)(pDVar1 + 0xe0) * 0x80),0,0,uVar2,uVar3,0,0,1,0,
                            0x202,&attr_set);
      this->_background_window = WVar6;
      XSelectInput(pDVar1,WVar6,0x20000);
      XMapRaised(pDVar1,this->_background_window);
      do {
        XWindowEvent(pDVar1,this->_background_window,0x20000,&event);
      } while (event.type != 0x13);
      do {
        XGetWindowAttributes(pDVar1,this->_background_window,&attr);
        if (attr.map_state != 2) {
          XSync(pDVar1);
          local_1f0.tv_sec = 0;
          local_1f0.tv_nsec = 10000000;
          nanosleep(&local_1f0,(timespec *)0x0);
        }
      } while (attr.map_state != 2);
    }
  }
  return;
}

Assistant:

void _init_fullscreen() {
      if (!_is_fullscreen || _is_closed) return;
      Display *const dpy = cimg::X11_attr().display;
      _background_window = 0;

#ifdef cimg_use_xrandr
      int foo;
      if (XRRQueryExtension(dpy,&foo,&foo)) {
        XRRRotations(dpy,DefaultScreen(dpy),&cimg::X11_attr().curr_rotation);
        if (!cimg::X11_attr().resolutions) {
          cimg::X11_attr().resolutions = XRRSizes(dpy,DefaultScreen(dpy),&foo);
          cimg::X11_attr().nb_resolutions = (unsigned int)foo;
        }
        if (cimg::X11_attr().resolutions) {
          cimg::X11_attr().curr_resolution = 0;
          for (unsigned int i = 0; i<cimg::X11_attr().nb_resolutions; ++i) {
            const unsigned int
              nw = (unsigned int)(cimg::X11_attr().resolutions[i].width),
              nh = (unsigned int)(cimg::X11_attr().resolutions[i].height);
            if (nw>=_width && nh>=_height &&
                nw<=(unsigned int)(cimg::X11_attr().resolutions[cimg::X11_attr().curr_resolution].width) &&
                nh<=(unsigned int)(cimg::X11_attr().resolutions[cimg::X11_attr().curr_resolution].height))
              cimg::X11_attr().curr_resolution = i;
          }
          if (cimg::X11_attr().curr_resolution>0) {
            XRRScreenConfiguration *config = XRRGetScreenInfo(dpy,DefaultRootWindow(dpy));
            XRRSetScreenConfig(dpy,config,DefaultRootWindow(dpy),
                               cimg::X11_attr().curr_resolution,cimg::X11_attr().curr_rotation,CurrentTime);
            XRRFreeScreenConfigInfo(config);
            XSync(dpy,0);
          }
        }
      }
      if (!cimg::X11_attr().resolutions)
        cimg::warn(_cimgdisplay_instance
                   "init_fullscreen(): Xrandr extension not supported by the X server.",
                   cimgdisplay_instance);
#endif

      const unsigned int sx = screen_width(), sy = screen_height();
      if (sx==_width && sy==_height) return;
      XSetWindowAttributes attr_set;

      attr_set.background_pixel = XBlackPixel(dpy,XDefaultScreen(dpy));
      attr_set.override_redirect = 1;
      _background_window = XCreateWindow(dpy,DefaultRootWindow(dpy),0,0,sx,sy,0,0,
                                         InputOutput,CopyFromParent,CWBackPixel | CWOverrideRedirect,&attr_set);
      XEvent event;
      XSelectInput(dpy,_background_window,StructureNotifyMask);
      XMapRaised(dpy,_background_window);
      do XWindowEvent(dpy,_background_window,StructureNotifyMask,&event);
      while (event.type!=MapNotify);

      XWindowAttributes attr;
      do {
        XGetWindowAttributes(dpy,_background_window,&attr);
        if (attr.map_state!=IsViewable) { XSync(dpy,0); cimg::sleep(10); }
      } while (attr.map_state!=IsViewable);
    }